

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::Clear(FileOptions *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  FileOptions *this_local;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_java_package(this);
    if ((bVar1) && (this->java_package_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    bVar1 = has_java_outer_classname(this);
    if ((bVar1) && (this->java_outer_classname_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    this->java_multiple_files_ = false;
    this->java_generate_equals_and_hash_ = false;
    this->optimize_for_ = 1;
    bVar1 = has_go_package(this);
    if ((bVar1) && (this->go_package_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    this->cc_generic_services_ = false;
    this->java_generic_services_ = false;
  }
  if ((this->_has_bits_[0] & 0xff00) != 0) {
    this->py_generic_services_ = false;
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear(&this->uninterpreted_option_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void FileOptions::Clear() {
  _extensions_.Clear();
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_java_package()) {
      if (java_package_ != &::google::protobuf::internal::kEmptyString) {
        java_package_->clear();
      }
    }
    if (has_java_outer_classname()) {
      if (java_outer_classname_ != &::google::protobuf::internal::kEmptyString) {
        java_outer_classname_->clear();
      }
    }
    java_multiple_files_ = false;
    java_generate_equals_and_hash_ = false;
    optimize_for_ = 1;
    if (has_go_package()) {
      if (go_package_ != &::google::protobuf::internal::kEmptyString) {
        go_package_->clear();
      }
    }
    cc_generic_services_ = false;
    java_generic_services_ = false;
  }
  if (_has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    py_generic_services_ = false;
  }
  uninterpreted_option_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}